

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FindAllExtensionNumbers
          (DescriptorIndex *this,string_view containing_type,
          vector<int,_std::allocator<int>_> *output)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  pointer pEVar2;
  string_view __x;
  bool local_a1;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  local_78;
  DescriptorIndex *local_70;
  int local_64;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int> local_60;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  local_48;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  local_40;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  local_38;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  it;
  bool success;
  vector<int,_std::allocator<int>_> *output_local;
  DescriptorIndex *this_local;
  string_view containing_type_local;
  
  containing_type_local._M_len = (size_t)containing_type._M_str;
  this_local = (DescriptorIndex *)containing_type._M_len;
  EnsureFlat(this);
  it._M_current._7_1_ = 0;
  local_40._M_current =
       (ExtensionEntry *)
       std::
       vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
       ::begin(&this->by_extension_flat_);
  local_48._M_current =
       (ExtensionEntry *)
       std::
       vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
       ::end(&this->by_extension_flat_);
  local_64 = 0;
  std::make_tuple<std::basic_string_view<char,std::char_traits<char>>&,int>
            (&local_60,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_64);
  local_70 = (DescriptorIndex *)
             absl::lts_20250127::container_internal::
             btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
             ::key_comp((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
                         *)&this->by_extension_);
  local_38 = std::
             lower_bound<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,int>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                       (local_40,local_48,&local_60,(ExtensionCompare)local_70);
  while( true ) {
    local_78._M_current =
         (ExtensionEntry *)
         std::
         vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
         ::end(&this->by_extension_flat_);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_78);
    local_a1 = false;
    if (bVar1) {
      pEVar2 = __gnu_cxx::
               __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
               ::operator->(&local_38);
      __x = ExtensionEntry::extendee(pEVar2,this);
      __y._M_str = (char *)containing_type_local._M_len;
      __y._M_len = (size_t)this_local;
      local_a1 = std::operator==(__x,__y);
    }
    if (local_a1 == false) break;
    pEVar2 = __gnu_cxx::
             __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
             ::operator->(&local_38);
    std::vector<int,_std::allocator<int>_>::push_back(output,&pEVar2->extension_number);
    it._M_current._7_1_ = 1;
    __gnu_cxx::
    __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
    ::operator++(&local_38);
  }
  return (bool)(it._M_current._7_1_ & 1);
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::FindAllExtensionNumbers(
    absl::string_view containing_type, std::vector<int>* output) {
  EnsureFlat();

  bool success = false;
  auto it = std::lower_bound(
      by_extension_flat_.begin(), by_extension_flat_.end(),
      std::make_tuple(containing_type, 0), by_extension_.key_comp());
  for (;
       it != by_extension_flat_.end() && it->extendee(*this) == containing_type;
       ++it) {
    output->push_back(it->extension_number);
    success = true;
  }

  return success;
}